

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall
Parser::PushFuncBlockScope
          (Parser *this,ParseNodeBlock *pnodeBlock,ParseNodePtr **ppnodeScopeSave,
          ParseNodePtr **ppnodeExprScopeSave)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodePtr *ppPVar4;
  ParseNodePtr *ppPVar5;
  
  ppPVar5 = &pnodeBlock->pnodeNext;
  pnodeBlock->pnodeScopes = (ParseNodePtr)0x0;
  pnodeBlock->pnodeNext = (ParseNodePtr)0x0;
  ppPVar4 = this->m_ppnodeScope;
  if (this->m_ppnodeExprScope == (ParseNodePtr *)0x0) {
    if (ppPVar4 == (ParseNodePtr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x66f,"(m_ppnodeScope)","m_ppnodeScope");
      if (!bVar2) goto LAB_00ce605a;
      *puVar3 = 0;
      ppPVar4 = this->m_ppnodeScope;
    }
    if (*ppPVar4 != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x670,"(*m_ppnodeScope == nullptr)","*m_ppnodeScope == nullptr");
      if (!bVar2) goto LAB_00ce605a;
      *puVar3 = 0;
      ppPVar4 = this->m_ppnodeScope;
    }
    *ppPVar4 = (ParseNodePtr)pnodeBlock;
    *ppnodeScopeSave = ppPVar5;
    ppPVar5 = this->m_ppnodeExprScope;
  }
  else {
    *ppnodeScopeSave = ppPVar4;
    ppPVar4 = this->m_ppnodeExprScope;
    if (*ppPVar4 != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x669,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr");
      if (!bVar2) {
LAB_00ce605a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      ppPVar4 = this->m_ppnodeExprScope;
    }
    *ppPVar4 = (ParseNodePtr)pnodeBlock;
  }
  *ppnodeExprScopeSave = ppPVar5;
  this->m_ppnodeScope = &pnodeBlock->pnodeScopes;
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  return;
}

Assistant:

void Parser::PushFuncBlockScope(ParseNodeBlock * pnodeBlock, ParseNodePtr **ppnodeScopeSave, ParseNodePtr **ppnodeExprScopeSave)
{
    // Maintain the scope tree.

    pnodeBlock->pnodeScopes = nullptr;
    pnodeBlock->pnodeNext = nullptr;

    // Insert this block into the active list of scopes (m_ppnodeExprScope or m_ppnodeScope).
    // Save the current block's "next" pointer as the new endpoint of that list.
    if (m_ppnodeExprScope)
    {
        *ppnodeScopeSave = m_ppnodeScope;

        Assert(*m_ppnodeExprScope == nullptr);
        *m_ppnodeExprScope = pnodeBlock;
        *ppnodeExprScopeSave = &pnodeBlock->pnodeNext;
    }
    else
    {
        Assert(m_ppnodeScope);
        Assert(*m_ppnodeScope == nullptr);
        *m_ppnodeScope = pnodeBlock;
        *ppnodeScopeSave = &pnodeBlock->pnodeNext;

        *ppnodeExprScopeSave = m_ppnodeExprScope;
    }

    // Advance the global scope list pointer to the new block's child list.
    m_ppnodeScope = &pnodeBlock->pnodeScopes;
    // Set m_ppnodeExprScope to NULL to make that list inactive.
    m_ppnodeExprScope = nullptr;
}